

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O3

void __thiscall
io::
CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
::
read_header<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
          (CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
           *this,ignore_column ignore_policy,char *cols,char *cols_1,char *cols_2,char *cols_3,
          char *cols_4,char *cols_5,char *cols_6,char *cols_7,char *cols_8,char *cols_9,
          char *cols_10,char *cols_11)

{
  char *line;
  undefined8 *__s;
  string local_58;
  allocator local_31;
  
  std::__cxx11::string::string((string *)&local_58,cols,&local_31);
  set_column_names<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (this,&local_58,cols_1,cols_2,cols_3,cols_4,cols_5,cols_6,cols_7,cols_8,cols_9,cols_10,
             cols_11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  line = LineReader::next_line((LineReader *)this);
  if (line != (char *)0x0) {
    detail::parse_header_line<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>>
              (line,(vector<int,_std::allocator<int>_> *)(this + 0x3b0),(string *)(this + 0x230),
               ignore_policy);
    return;
  }
  __s = (undefined8 *)__cxa_allocate_exception(0x208);
  memset(__s,0,0x208);
  *__s = &PTR__exception_00120820;
  __cxa_throw(__s,&error::header_missing::typeinfo,std::exception::~exception);
}

Assistant:

void read_header(ignore_column ignore_policy, ColNames...cols){
                        static_assert(sizeof...(ColNames)>=column_count, "not enough column names specified");
                        static_assert(sizeof...(ColNames)<=column_count, "too many column names specified");
                        try{
                                set_column_names(std::forward<ColNames>(cols)...);

                                char*line;
                                do{
                                        line = in.next_line();
                                        if(!line)
                                                throw error::header_missing();
                                }while(comment_policy::is_comment(line));

                                detail::parse_header_line
                                        <column_count, trim_policy, quote_policy>
                                        (line, col_order, column_names, ignore_policy);
                        }catch(error::with_file_name&err){
                                err.set_file_name(in.get_truncated_file_name());
                                throw;
                        }
                }